

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTSnapValues.cpp
# Opt level: O2

bool TTD::NSSnapValues::CheckSnapEquivTTDDouble(double d1,double d2)

{
  BOOL BVar1;
  bool bVar2;
  
  BVar1 = Js::JavascriptNumber::IsNan(d1);
  if ((BVar1 == 0) && (BVar1 = Js::JavascriptNumber::IsNan(d2), BVar1 == 0)) {
    return (bool)(-(d1 == d2) & 1);
  }
  BVar1 = Js::JavascriptNumber::IsNan(d1);
  if (BVar1 == 0) {
    bVar2 = false;
  }
  else {
    BVar1 = Js::JavascriptNumber::IsNan(d2);
    bVar2 = BVar1 != 0;
  }
  return bVar2;
}

Assistant:

bool CheckSnapEquivTTDDouble(double d1, double d2)
        {
            if(Js::JavascriptNumber::IsNan(d1) || Js::JavascriptNumber::IsNan(d2))
            {
                return (Js::JavascriptNumber::IsNan(d1) && Js::JavascriptNumber::IsNan(d2));
            }
            else
            {
                return (d1 == d2);
            }
        }